

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::HavingBinder::BindWindow
          (BindResult *__return_storage_ptr__,HavingBinder *this,WindowExpression *expr,idx_t depth)

{
  BinderException local_50;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"HAVING clause cannot contain window functions!","");
  BinderException::Unsupported(&local_50,&expr->super_ParsedExpression,&local_40);
  BindResult::BindResult(__return_storage_ptr__,&local_50.super_Exception);
  ::std::runtime_error::~runtime_error((runtime_error *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult HavingBinder::BindWindow(WindowExpression &expr, idx_t depth) {
	return BindResult(BinderException::Unsupported(expr, "HAVING clause cannot contain window functions!"));
}